

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *table)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  undefined2 uVar7;
  uint uVar8;
  ImDrawCmd *pIVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [16];
  unsigned_short *puVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  ImGuiContext *pIVar18;
  bool bVar19;
  short sVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ImDrawChannel *pIVar24;
  int n;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ImDrawChannel *pIVar28;
  long lVar29;
  ImGuiTableColumn *pIVar30;
  ulong uVar31;
  float *pfVar32;
  uint uVar33;
  ImBitArray<130> *pIVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  ImBitArray<130> remaining_mask;
  uint local_118;
  ImBitArray<130> local_f8;
  float local_d8 [2];
  undefined8 uStack_d0;
  int local_c8;
  ImBitArray<130> local_c4 [7];
  
  pIVar18 = GImGui;
  cVar4 = table->FreezeRowsCount;
  cVar5 = table->FreezeColumnsCount;
  memset(local_d8,0,0xa0);
  iVar27 = table->ColumnsCount;
  if (0 < iVar27) {
    uVar8 = table->Flags;
    uVar26 = 0;
    local_118 = 0;
    do {
      if ((table->VisibleUnclippedMaskByIndex >> (uVar26 & 0x3f) & 1) != 0) {
        pIVar30 = (table->Columns).Data + uVar26;
        if ((table->Columns).DataEnd <= pIVar30) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s");
        }
        bVar19 = false;
        lVar29 = 1;
        uVar33 = 0;
        do {
          iVar27 = (int)*(char *)((long)pIVar30 + (0x5e - lVar29));
          if ((table->DrawSplitter)._Channels.Size <= iVar27) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
          }
          pIVar24 = (table->DrawSplitter)._Channels.Data;
          iVar21 = pIVar24[iVar27]._CmdBuffer.Size;
          if (0 < (long)iVar21) {
            pIVar24 = pIVar24 + iVar27;
            if ((pIVar24->_CmdBuffer).Data[(long)iVar21 + -1].ElemCount == 0) {
              iVar21 = iVar21 + -1;
              (pIVar24->_CmdBuffer).Size = iVar21;
            }
            if (iVar21 == 1) {
              if ((pIVar30->Flags & 0x40) == 0) {
                if (cVar4 < '\x01') {
                  sVar6 = pIVar30->ContentWidthRowsUnfrozen;
LAB_001f01ea:
                  uVar7 = pIVar30->ContentWidthHeadersUsed;
                  sVar20 = uVar7;
                  if ((short)uVar7 < sVar6) {
                    sVar20 = sVar6;
                  }
                }
                else {
                  if (lVar29 != 0) {
                    sVar6 = pIVar30->ContentWidthRowsFrozen;
                    goto LAB_001f01ea;
                  }
                  sVar20 = pIVar30->ContentWidthRowsUnfrozen;
                }
                if (pIVar30->WidthGiven <= (float)(int)sVar20 &&
                    (float)(int)sVar20 != pIVar30->WidthGiven) goto LAB_001f0302;
              }
              if (cVar5 < '\x01') {
                uVar22 = 2;
              }
              else {
                uVar22 = (uint)((long)table->FreezeColumnsCount <= (long)uVar26) * 2;
              }
              if (cVar4 < '\x01') {
                uVar33 = 1;
              }
              uVar31 = (ulong)(uVar33 | uVar22);
              pfVar32 = local_d8 + uVar31 * 10;
              if ((&local_c8)[uVar31 * 10] == 0) {
                pfVar32[0] = 3.4028235e+38;
                pfVar32[1] = 3.4028235e+38;
                (&uStack_d0)[uVar31 * 5] = 0xff7fffffff7fffff;
              }
              ImBitArray<130>::SetBit(local_c4 + uVar31 * 2,iVar27);
              (&local_c8)[uVar31 * 10] = (&local_c8)[uVar31 * 10] + 1;
              if ((pIVar24->_CmdBuffer).Size < 1) {
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                            ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
              }
              pIVar9 = (pIVar24->_CmdBuffer).Data;
              fVar36 = (pIVar9->ClipRect).x;
              fVar37 = (pIVar9->ClipRect).y;
              fVar2 = (pIVar9->ClipRect).z;
              fVar38 = (pIVar9->ClipRect).w;
              if (fVar36 < *pfVar32) {
                *pfVar32 = fVar36;
              }
              if (fVar37 < local_d8[uVar31 * 10 + 1]) {
                local_d8[uVar31 * 10 + 1] = fVar37;
              }
              if (*(float *)(&uStack_d0 + uVar31 * 5) <= fVar2 &&
                  fVar2 != *(float *)(&uStack_d0 + uVar31 * 5)) {
                *(float *)(&uStack_d0 + uVar31 * 5) = fVar2;
              }
              pfVar32 = (float *)((long)&uStack_d0 + uVar31 * 0x28 + 4);
              if (*pfVar32 <= fVar38 && fVar38 != *pfVar32) {
                *(float *)((long)&uStack_d0 + uVar31 * 0x28 + 4) = fVar38;
              }
              local_118 = local_118 | 1 << (uVar33 | uVar22);
            }
          }
LAB_001f0302:
          uVar33 = 1;
          lVar29 = 0;
          bVar15 = !bVar19;
          bVar19 = true;
        } while (bVar15 && '\0' < cVar4);
        pIVar30->DrawChannelCurrent = -1;
        iVar27 = table->ColumnsCount;
      }
      uVar26 = uVar26 + 1;
    } while ((long)uVar26 < (long)iVar27);
    if (local_118 != 0) {
      iVar21 = (table->DrawSplitter)._Count + -1;
      iVar27 = (pIVar18->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar27 < iVar21) {
        if (iVar27 == 0) {
          iVar27 = 8;
        }
        else {
          iVar27 = iVar27 / 2 + iVar27;
        }
        if (iVar27 <= iVar21) {
          iVar27 = iVar21;
        }
        pIVar24 = (ImDrawChannel *)MemAlloc((long)iVar27 << 5);
        pIVar28 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
        if (pIVar28 != (ImDrawChannel *)0x0) {
          memcpy(pIVar24,pIVar28,(long)(pIVar18->DrawChannelsTempMergeBuffer).Size << 5);
          MemFree((pIVar18->DrawChannelsTempMergeBuffer).Data);
        }
        (pIVar18->DrawChannelsTempMergeBuffer).Data = pIVar24;
        (pIVar18->DrawChannelsTempMergeBuffer).Capacity = iVar27;
        iVar27 = (table->DrawSplitter)._Count + -1;
      }
      else {
        pIVar24 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
        iVar27 = iVar21;
      }
      (pIVar18->DrawChannelsTempMergeBuffer).Size = iVar21;
      local_f8.Storage[0] = 0;
      local_f8.Storage[1] = 0;
      local_f8.Storage[2] = 0;
      local_f8.Storage[3] = 0;
      local_f8.Storage[4] = 0;
      ImBitArray<130>::SetBitRange(&local_f8,1,iVar27);
      uVar33 = (table->DrawSplitter)._Count;
      uVar26 = (ulong)uVar33;
      iVar27 = uVar33 - 1;
      uVar31 = (ulong)((uVar8 >> 0x12 & 1) == 0) << 5 | 0x104;
      pIVar34 = local_c4;
      lVar29 = 0;
      do {
        iVar21 = (&local_c8)[lVar29 * 10];
        if (iVar21 != 0) {
          fVar37 = local_d8[lVar29 * 10];
          fVar2 = local_d8[lVar29 * 10 + 1];
          fVar38 = *(float *)(&uStack_d0 + lVar29 * 5);
          fVar39 = *(float *)((long)&uStack_d0 + lVar29 * 0x28 + 4);
          fVar36 = fVar2;
          if (local_118 == 8 && (cVar4 < '\x01' && cVar5 < '\x01')) {
            if (lVar29 != 3) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                          ,0x2448,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                          "merge_group_n == 3");
            }
            fVar3 = *(float *)((long)&table->ID + uVar31);
            fVar36 = *(float *)((long)&table->Flags + uVar31);
            if (fVar3 < fVar37) {
              fVar37 = fVar3;
            }
            if (fVar2 <= fVar36) {
              fVar36 = fVar2;
            }
            fVar2 = *(float *)((long)&(table->RawData).Size + uVar31);
            if (fVar38 < fVar2) {
              fVar38 = fVar2;
            }
            fVar2 = *(float *)((long)&(table->RawData).Capacity + uVar31);
            if (fVar39 < fVar2) {
              fVar39 = fVar2;
            }
          }
          iVar23 = (&local_c8)[lVar29 * 10];
          lVar25 = 0;
          do {
            local_f8.Storage[lVar25] = local_f8.Storage[lVar25] & ~pIVar34->Storage[lVar25];
            lVar25 = lVar25 + 1;
          } while (lVar25 != 5);
          iVar27 = iVar27 - iVar23;
          uVar8 = (table->DrawSplitter)._Count;
          uVar26 = (ulong)uVar8;
          if (0 < (int)uVar8) {
            lVar25 = 0;
            lVar35 = 0;
            do {
              bVar19 = ImBitArray<130>::TestBit(local_c4 + lVar29 * 2,(int)lVar35);
              if (bVar19) {
                ImBitArray<130>::ClearBit(local_c4 + lVar29 * 2,(int)lVar35);
                if ((table->DrawSplitter)._Channels.Size <= lVar35) {
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                              ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
                }
                pIVar28 = (table->DrawSplitter)._Channels.Data;
                piVar1 = (int *)((long)&(pIVar28->_CmdBuffer).Size + lVar25);
                if (*(int *)((long)&(pIVar28->_CmdBuffer).Size + lVar25) == 1) {
                  pfVar32 = *(float **)((long)&(pIVar28->_CmdBuffer).Data + lVar25);
                  auVar11._4_4_ = -(uint)(pfVar32[1] < fVar36);
                  auVar11._0_4_ = -(uint)(*pfVar32 < fVar37);
                  auVar11._8_4_ = -(uint)(fVar38 < pfVar32[2]);
                  auVar11._12_4_ = -(uint)(fVar39 < pfVar32[3]);
                  iVar23 = movmskps((int)pfVar32,auVar11);
                  if (iVar23 != 0) goto LAB_001f0653;
                }
                else {
LAB_001f0653:
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                              ,0x245b,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                              "channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                             );
                  if (*piVar1 < 1) {
                    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
                  }
                }
                iVar21 = iVar21 + -1;
                puVar10 = *(undefined8 **)((long)&(pIVar28->_CmdBuffer).Data + lVar25);
                *puVar10 = CONCAT44(fVar36,fVar37);
                puVar10[1] = CONCAT44(fVar39,fVar38);
                iVar16 = piVar1[0];
                iVar17 = piVar1[1];
                pIVar9 = *(ImDrawCmd **)(piVar1 + 2);
                iVar23 = piVar1[5];
                puVar12 = *(unsigned_short **)(piVar1 + 6);
                (pIVar24->_IdxBuffer).Size = piVar1[4];
                (pIVar24->_IdxBuffer).Capacity = iVar23;
                (pIVar24->_IdxBuffer).Data = puVar12;
                (pIVar24->_CmdBuffer).Size = iVar16;
                (pIVar24->_CmdBuffer).Capacity = iVar17;
                (pIVar24->_CmdBuffer).Data = pIVar9;
                pIVar24 = pIVar24 + 1;
              }
              lVar35 = lVar35 + 1;
              uVar26 = (ulong)(table->DrawSplitter)._Count;
            } while ((lVar35 < (long)uVar26) && (lVar25 = lVar25 + 0x20, iVar21 != 0));
          }
        }
        iVar21 = (int)uVar26;
        lVar29 = lVar29 + 1;
        pIVar34 = pIVar34 + 2;
      } while (lVar29 != 4);
      if ((0 < iVar21) && (iVar27 != 0)) {
        lVar29 = 0;
        lVar25 = 0;
        do {
          bVar19 = ImBitArray<130>::TestBit(&local_f8,(int)lVar25);
          if (bVar19) {
            if ((table->DrawSplitter)._Channels.Size <= lVar25) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                          ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            }
            pIVar28 = (table->DrawSplitter)._Channels.Data;
            puVar10 = (undefined8 *)((long)&(pIVar28->_CmdBuffer).Size + lVar29);
            uVar13 = *puVar10;
            pIVar9 = (ImDrawCmd *)puVar10[1];
            puVar10 = (undefined8 *)((long)&(pIVar28->_IdxBuffer).Size + lVar29);
            uVar14 = *puVar10;
            puVar12 = (unsigned_short *)puVar10[1];
            (pIVar24->_IdxBuffer).Size = (int)uVar14;
            (pIVar24->_IdxBuffer).Capacity = (int)((ulong)uVar14 >> 0x20);
            (pIVar24->_IdxBuffer).Data = puVar12;
            (pIVar24->_CmdBuffer).Size = (int)uVar13;
            (pIVar24->_CmdBuffer).Capacity = (int)((ulong)uVar13 >> 0x20);
            (pIVar24->_CmdBuffer).Data = pIVar9;
            pIVar24 = pIVar24 + 1;
            iVar27 = iVar27 + -1;
          }
          lVar25 = lVar25 + 1;
          iVar21 = (table->DrawSplitter)._Count;
        } while ((lVar25 < iVar21) && (lVar29 = lVar29 + 0x20, iVar27 != 0));
      }
      pIVar28 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
      if (pIVar24 != pIVar28 + (pIVar18->DrawChannelsTempMergeBuffer).Size) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x246a,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                    "dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                   );
        pIVar28 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
        iVar21 = (table->DrawSplitter)._Count;
      }
      memcpy((table->DrawSplitter)._Channels.Data + 1,pIVar28,(long)iVar21 * 0x20 - 0x20);
    }
  }
  return;
}

Assistant:

void    ImGui::TableReorderDrawChannelsForMerge(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool is_frozen_v = (table->FreezeRowsCount > 0);
    const bool is_frozen_h = (table->FreezeColumnsCount > 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));
    bool merge_groups_all_fit_within_inner_rect = (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0;

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = is_frozen_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelRowsBeforeFreeze : column->DrawChannelRowsAfterFreeze;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column.
            if (!(column->Flags & ImGuiTableColumnFlags_NoClipX))
            {
                float width_contents;
                if (merge_group_sub_count == 1)     // No row freeze (same as testing !is_frozen_v)
                    width_contents = ImMax(column->ContentWidthRowsUnfrozen, column->ContentWidthHeadersUsed);
                else if (merge_group_sub_n == 0)    // Row freeze: use width before freeze
                    width_contents = ImMax(column->ContentWidthRowsFrozen, column->ContentWidthHeadersUsed);
                else                                // Row freeze: use width after freeze
                    width_contents = column->ContentWidthRowsUnfrozen;
                if (width_contents > column->WidthGiven)
                    continue;
            }

            const int merge_group_dst_n = (is_frozen_h && column_n < table->FreezeColumnsCount ? 0 : 2) + (is_frozen_v ? merge_group_sub_n : 1);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_dst_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_dst_n);

            // If we end with a single group and hosted by the outer window, we'll attempt to merge our draw command
            // with the existing outer window command. But we can only do so if our columns all fit within the expected
            // clip rect, otherwise clipping will be incorrect when ScrollX is disabled.
            // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column don't fit within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect

            // 2019/10/22: (1) This is breaking table_2_draw_calls but I cannot seem to repro what it is attempting to
            // fix... cf git fce2e8dc "Fixed issue with clipping when outerwindow==innerwindow / support ScrollH without ScrollV."
            // 2019/10/22: (2) Clamping code in TableUpdateLayout() seemingly made this not necessary...
#if 0
            if (column->MinX < table->InnerClipRect.Min.x || column->MaxX > table->InnerClipRect.Max.x)
                merge_groups_all_fit_within_inner_rect = false;
#endif
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelBeforeRowFreeze/DrawChannelAfterRowFreeze solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = -1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // Conceptually we want to test if only 1 bit of merge_group_mask is set, but with no freezing we know it's always going to be group 3.
        // We need to test for !is_frozen because any unfitting column will not be part of a merge group, so testing for merge_group_mask isn't enough.
        const bool may_extend_clip_rect_to_host_rect = (merge_group_mask == (1 << 3)) && !is_frozen_v && !is_frozen_h;

        // Use shared temporary storage so the allocation gets amortized
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - 1);
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask; // We need 130-bit of storage
        remaining_mask.ClearBits();
        remaining_mask.SetBitRange(1, splitter->_Count - 1); // Background channel 0 not part of the merge (see channel allocation in TableUpdateDrawChannels)
        int remaining_count = splitter->_Count - 1;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_groups[merge_group_n].ClipRect;
                if (may_extend_clip_rect_to_host_rect)
                {
                    IM_ASSERT(merge_group_n == 3);
                    //GetOverlayDrawList()->AddRect(table->HostClipRect.Min, table->HostClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 3.0f);
                    //GetOverlayDrawList()->AddRect(table->InnerClipRect.Min, table->InnerClipRect.Max, IM_COL32(0, 255, 0, 200), 0.0f, ~0, 1.0f);
                    //GetOverlayDrawList()->AddRect(merge_clip_rect.Min, merge_clip_rect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 2.0f);
                    merge_clip_rect.Add(merge_groups_all_fit_within_inner_rect ? table->HostClipRect : table->InnerClipRect);
                    //GetOverlayDrawList()->AddRect(merge_clip_rect.Min, merge_clip_rect.Max, IM_COL32(0, 255, 0, 200));
                }
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + 1, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - 1) * sizeof(ImDrawChannel));
    }
}